

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-dis.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  string *psVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  allocator<char> local_1011;
  key_type local_1010;
  Output local_ff0 [8];
  Output output;
  ParseException *p;
  MapParseException *p_1;
  allocator<char> local_811;
  key_type local_810;
  string local_7f0 [36];
  ModuleReader local_7cc;
  undefined1 local_7c0 [8];
  Module wasm;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_3c8;
  allocator<char> local_3a1;
  string local_3a0 [32];
  anon_class_8_1_8b266608 local_380;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_378;
  allocator<char> local_351;
  string local_350 [39];
  allocator<char> local_329;
  string local_328 [39];
  allocator<char> local_301;
  string local_300 [39];
  anon_class_1_0_00000001 local_2d9;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_2d8;
  allocator<char> local_2b1;
  string local_2b0 [39];
  allocator<char> local_289;
  string local_288 [39];
  allocator<char> local_261;
  string local_260 [39];
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  undefined1 local_1f0 [8];
  ToolOptions options;
  allocator<char> local_59;
  string local_58 [8];
  string WasmDisOption;
  string sourceMapFilename;
  char **argv_local;
  int argc_local;
  
  std::__cxx11::string::string((string *)(WasmDisOption.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"wasm-dis options",&local_59);
  std::allocator<char>::~allocator(&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"wasm-dis",&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,
             "Un-assemble a .wasm (WebAssembly binary format) into a .wat (WebAssembly text format)"
             ,&local_239);
  ::wasm::ToolOptions::ToolOptions((ToolOptions *)local_1f0,&local_210,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_260,"--output",&local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_288,"-o",&local_289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2b0,"Output file (stdout if not specified)",&local_2b1);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__0,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_2d8,&local_2d9);
  psVar1 = (string *)
           ::wasm::Options::add
                     ((string *)&options,local_260,local_288,local_2b0,(Arguments)local_58,
                      (function *)0x1,SUB81(&local_2d8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_300,"--source-map",&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_328,"-sm",&local_329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_350,"Consume source map from the specified file to add location information",
             &local_351);
  local_380.sourceMapFilename = (string *)((long)&WasmDisOption.field_2 + 8);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__1,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_378,&local_380);
  psVar1 = (string *)
           ::wasm::Options::add
                     (psVar1,local_300,local_328,local_350,(Arguments)local_58,(function *)0x1,
                      SUB81(&local_378,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3a0,"INFILE",&local_3a1);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__2,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_3c8,
             (anon_class_1_0_00000001 *)((long)&wasm.tagsMap._M_h._M_single_bucket + 7));
  ::wasm::Options::add_positional(psVar1,(Arguments)local_3a0,(function *)0x1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_3c8);
  std::__cxx11::string::~string(local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_378);
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator(&local_351);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator(&local_329);
  std::__cxx11::string::~string(local_300);
  std::allocator<char>::~allocator(&local_301);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2d8);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator(&local_289);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator(&local_261);
  ::wasm::Options::parse((int)&options,(char **)(ulong)(uint)argc);
  if (((byte)options._vptr_ToolOptions & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"parsing binary...");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  ::wasm::Module::Module((Module *)local_7c0);
  ::wasm::ToolOptions::applyOptionsBeforeParse((ToolOptions *)local_1f0,(Module *)local_7c0);
  ::wasm::ModuleReader::ModuleReader(&local_7cc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_810,"infile",&local_811);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&options.super_Options,&local_810);
  std::__cxx11::string::string(local_7f0,(string *)pmVar3);
  std::__cxx11::string::string((string *)&p_1,(string *)(WasmDisOption.field_2._M_local_buf + 8));
  ::wasm::ModuleReader::readBinary(&local_7cc,local_7f0,local_7c0,&p_1);
  std::__cxx11::string::~string((string *)&p_1);
  std::__cxx11::string::~string(local_7f0);
  std::__cxx11::string::~string((string *)&local_810);
  std::allocator<char>::~allocator(&local_811);
  ::wasm::ToolOptions::applyOptionsAfterParse((ToolOptions *)local_1f0,(Module *)local_7c0);
  if (((byte)options._vptr_ToolOptions & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Printing...");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1010,"output",&local_1011);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&options.super_Options,&local_1010);
  ::wasm::Output::Output(local_ff0,(string *)pmVar3,Text);
  std::__cxx11::string::~string((string *)&local_1010);
  std::allocator<char>::~allocator(&local_1011);
  poVar2 = ::wasm::Output::getStream(local_ff0);
  poVar2 = (ostream *)std::operator<<(poVar2,(Module *)local_7c0);
  std::operator<<(poVar2,'\n');
  if (((byte)options._vptr_ToolOptions & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Done.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  ::wasm::Output::~Output(local_ff0);
  ::wasm::Module::~Module((Module *)local_7c0);
  ::wasm::ToolOptions::~ToolOptions((ToolOptions *)local_1f0);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)(WasmDisOption.field_2._M_local_buf + 8));
  return 0;
}

Assistant:

int main(int argc, const char* argv[]) {
  std::string sourceMapFilename;

  const std::string WasmDisOption = "wasm-dis options";

  ToolOptions options("wasm-dis",
                      "Un-assemble a .wasm (WebAssembly binary format) into a "
                      ".wat (WebAssembly text format)");
  options
    .add("--output",
         "-o",
         "Output file (stdout if not specified)",
         WasmDisOption,
         Options::Arguments::One,
         [](Options* o, const std::string& argument) {
           o->extra["output"] = argument;
           Colors::setEnabled(false);
         })
    .add(
      "--source-map",
      "-sm",
      "Consume source map from the specified file to add location information",
      WasmDisOption,
      Options::Arguments::One,
      [&sourceMapFilename](Options* o, const std::string& argument) {
        sourceMapFilename = argument;
      })
    .add_positional("INFILE",
                    Options::Arguments::One,
                    [](Options* o, const std::string& argument) {
                      o->extra["infile"] = argument;
                    });
  options.parse(argc, argv);

  if (options.debug) {
    std::cerr << "parsing binary..." << std::endl;
  }
  Module wasm;
  options.applyOptionsBeforeParse(wasm);
  try {
    ModuleReader().readBinary(options.extra["infile"], wasm, sourceMapFilename);
  } catch (ParseException& p) {
    p.dump(std::cerr);
    std::cerr << '\n';
    if (options.debug) {
      Fatal() << "error parsing wasm. here is what we read up to the error:\n"
              << wasm;
    } else {
      Fatal() << "error parsing wasm (try --debug for more info)";
    }
  } catch (MapParseException& p) {
    p.dump(std::cerr);
    std::cerr << '\n';
    Fatal() << "error in parsing wasm source mapping";
  }

  options.applyOptionsAfterParse(wasm);

  // TODO: Validation. However, validating would mean that users are forced to
  //       run with  wasm-dis -all  or such, to enable the features (unless the
  //       features section is present, but that's rare in general). It would be
  //       better to have an "autodetect" code path that enables used features
  //       eventually.

  if (options.debug) {
    std::cerr << "Printing..." << std::endl;
  }
  Output output(options.extra["output"], Flags::Text);
  output.getStream() << wasm << '\n';

  if (options.debug) {
    std::cerr << "Done." << std::endl;
  }
}